

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readdata.cpp
# Opt level: O0

unsigned_long CRC32Value(int i)

{
  undefined8 local_18;
  unsigned_long ulCRC;
  int j;
  int i_local;
  
  local_18 = (ulong)i;
  for (ulCRC._0_4_ = 8; 0 < (int)ulCRC; ulCRC._0_4_ = (int)ulCRC + -1) {
    if ((local_18 & 1) == 0) {
      local_18 = local_18 >> 1;
    }
    else {
      local_18 = local_18 >> 1 ^ 0xedb88320;
    }
  }
  return local_18;
}

Assistant:

unsigned long CRC32Value(int i)
{
    int j;
    unsigned long ulCRC;
    ulCRC = i;
    for ( j = 8 ; j > 0; j-- )
    {
        if ( ulCRC & 1 )
            ulCRC = ( ulCRC >> 1 ) ^ CRC32_POLYNOMIAL;
        else
            ulCRC >>= 1;
    }
    return ulCRC;
}